

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms462.cpp
# Opt level: O2

double r8_abs(double x)

{
  ulong uVar1;
  
  uVar1 = -(ulong)(x < -x);
  return (double)(~uVar1 & (ulong)x | (ulong)-x & uVar1);
}

Assistant:

double r8_abs ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_ABS returns the absolute value of an R8.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 November 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the quantity whose absolute value is desired.
//
//    Output, double R8_ABS, the absolute value of X.
//
{
  double value;

  if ( 0.0 <= x )
  {
    value = + x;
  }
  else
  {
    value = - x;
  }
  return value;
}